

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidCrop2(void)

{
  pointer pcVar1;
  int iVar2;
  ConvolutionLayerParams *pCVar3;
  bool bVar4;
  ModelDescription *pMVar5;
  Type *pTVar6;
  FeatureType *pFVar7;
  ArrayFeatureType *pAVar8;
  TypeUnion this;
  Type *this_00;
  CropLayerParams *this_01;
  ostream *poVar9;
  Result res;
  Model m1;
  undefined1 local_70 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  Model local_48;
  
  CoreML::Specification::Model::Model(&local_48);
  if (local_48.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_48.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_48.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_70 + 0x10;
  local_70._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_70);
  if ((pointer)local_70._0_8_ != pcVar1) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8 = (pFVar7->Type_).multiarraytype_;
  iVar2 = (pAVar8->shape_).total_size_;
  if ((pAVar8->shape_).current_size_ == iVar2) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar8->shape_,iVar2 + 1);
  }
  iVar2 = (pAVar8->shape_).current_size_;
  (pAVar8->shape_).current_size_ = iVar2 + 1;
  ((pAVar8->shape_).rep_)->elements[iVar2] = 1;
  if (local_48.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_48.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_48.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_70._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"input2","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_70);
  if ((pointer)local_70._0_8_ != pcVar1) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8 = (pFVar7->Type_).multiarraytype_;
  iVar2 = (pAVar8->shape_).total_size_;
  if ((pAVar8->shape_).current_size_ == iVar2) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar8->shape_,iVar2 + 1);
  }
  iVar2 = (pAVar8->shape_).current_size_;
  (pAVar8->shape_).current_size_ = iVar2 + 1;
  ((pAVar8->shape_).rep_)->elements[iVar2] = 2;
  if (local_48.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_48.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_48.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_70._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"probs","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_70);
  if ((pointer)local_70._0_8_ != pcVar1) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  if (local_48._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_48);
    local_48._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_48.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_48.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input2");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"probs");
  if (this_00->_oneof_case_[0] != 0xbe) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0xbe;
    this_01 = (CropLayerParams *)operator_new(0x38);
    CoreML::Specification::CropLayerParams::CropLayerParams(this_01);
    (this_00->layer_).crop_ = this_01;
  }
  pCVar3 = (this_00->layer_).convolution_;
  iVar2 = (pCVar3->kernelsize_).total_size_;
  if ((pCVar3->kernelsize_).current_size_ == iVar2) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&pCVar3->kernelsize_,iVar2 + 1);
  }
  iVar2 = (pCVar3->kernelsize_).current_size_;
  (pCVar3->kernelsize_).current_size_ = iVar2 + 1;
  ((pCVar3->kernelsize_).rep_)->elements[iVar2] = 1;
  CoreML::validate<(MLModelType)500>((Result *)local_70,&local_48);
  bVar4 = CoreML::Result::good((Result *)local_70);
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xec0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._8_8_ != &local_58) {
    operator_delete((void *)local_70._8_8_,local_58._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_48);
  return (uint)bVar4;
}

Assistant:

int testInvalidCrop2() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *topIn2 = m1.mutable_description()->add_input();
    topIn2->set_name("input2");
    auto* shape2 = topIn2->mutable_type()->mutable_multiarraytype();
    shape2->add_shape(2);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *cropLayer = nn->add_layers();
    cropLayer->add_input("input");
    cropLayer->add_input("input2");
    cropLayer->add_output("probs");
    auto *params = cropLayer->mutable_crop();
    params->add_offset(1);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;
}